

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

bool __thiscall table::insertcheck(table *this,InsertStatement *stmt)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  ostream *poVar8;
  reference ppcVar9;
  column *pcVar10;
  ulong uVar11;
  reference ppcVar12;
  size_t sVar13;
  reference ppEVar14;
  char *pcVar15;
  char *bytes_2;
  __mbstate_t local_328;
  int local_31c;
  char *pcStack_318;
  int j_2;
  char *bytes_1;
  __mbstate_t local_308;
  int local_2fc;
  __cxx11 local_2f8 [4];
  int j_1;
  char *local_2d8;
  char *str_1;
  char *bytes;
  __mbstate_t local_2c0;
  int local_2b4;
  char *pcStack_2b0;
  int j;
  char *str;
  column *pcStack_2a0;
  int i;
  column *primary;
  char local_290 [8];
  fstream os;
  allocator local_69;
  string local_68 [32];
  column *local_48;
  column *it;
  char *col_name;
  iterator __end2;
  iterator __begin2;
  vector<char_*,_std::allocator<char_*>_> *__range2;
  InsertStatement *stmt_local;
  table *this_local;
  
  if (stmt->columns != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    sVar6 = std::vector<char_*,_std::allocator<char_*>_>::size(stmt->columns);
    sVar7 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::size(stmt->values);
    if (sVar6 != sVar7) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Column count doesn\'t match value count");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      return false;
    }
  }
  if (stmt->columns == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    sVar6 = std::vector<column_*,_std::allocator<column_*>_>::size(&this->table_cols);
    sVar7 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::size(stmt->values);
    if (sVar6 != sVar7) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "INSERT has different number of columns than target columns");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      return false;
    }
  }
  if (stmt->columns != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    this_00 = stmt->columns;
    __end2 = std::vector<char_*,_std::allocator<char_*>_>::begin(this_00);
    col_name = (char *)std::vector<char_*,_std::allocator<char_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                       *)&col_name), bVar1) {
      ppcVar9 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                ::operator*(&__end2);
      pcVar10 = (column *)*ppcVar9;
      it = pcVar10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,(char *)pcVar10,&local_69);
      pcVar10 = getColumn(this,(string *)local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      local_48 = pcVar10;
      if (pcVar10 == (column *)0x0) {
        poVar8 = std::operator<<((ostream *)&std::cout,"Unknown column ");
        poVar8 = std::operator<<(poVar8,(char *)it);
        poVar8 = std::operator<<(poVar8," in table list\'");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        return false;
      }
      __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
      operator++(&__end2);
    }
  }
  _Var3 = std::operator|(_S_in,_S_out);
  _Var3 = std::operator|(_Var3,_S_bin);
  _Var3 = std::operator|(_Var3,_S_app);
  std::fstream::fstream(local_290,(string *)&this->filename,_Var3);
  bVar2 = std::fstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"cannot open table file");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    pcStack_2a0 = getPrimaryKey(this);
    for (str._4_4_ = 0; uVar11 = (ulong)str._4_4_,
        sVar6 = std::vector<column_*,_std::allocator<column_*>_>::size(&this->table_cols),
        uVar11 < sVar6; str._4_4_ = str._4_4_ + 1) {
      ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                           (&this->table_cols,(long)str._4_4_);
      bVar1 = std::operator==(&(*ppcVar12)->flag,"CHAR");
      if (bVar1) {
        ppEVar14 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                             (stmt->values,(long)str._4_4_);
        if ((*ppEVar14)->type == kExprLiteralString) {
          ppEVar14 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                               (stmt->values,(long)str._4_4_);
          pcStack_2b0 = (*ppEVar14)->name;
          sVar13 = strlen(pcStack_2b0);
          ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                               (&this->table_cols,(long)str._4_4_);
          if ((ulong)(long)(*ppcVar12)->element_truesize < sVar13) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Wrong Char size");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
            goto LAB_00138680;
          }
          if (pcStack_2a0 != (column *)0x0) {
            ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                 (&this->table_cols,(long)str._4_4_);
            bVar1 = util::compareString(&(*ppcVar12)->name,&pcStack_2a0->name);
            if (bVar1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"check primary key values");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              for (local_2b4 = 0; iVar5 = local_2b4, iVar4 = getRowlength(this), iVar5 < iVar4;
                  local_2b4 = local_2b4 + 1) {
                iVar5 = local_2b4 * this->rowSize;
                ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                     (&this->table_cols,(long)str._4_4_);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)&bytes,(long)(iVar5 + (*ppcVar12)->col_offset));
                std::istream::seekg(local_290,bytes,local_2c0);
                ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                     (&this->table_cols,(long)str._4_4_);
                uVar11 = (ulong)(*ppcVar12)->element_truesize;
                if ((long)uVar11 < 0) {
                  uVar11 = 0xffffffffffffffff;
                }
                pcVar15 = (char *)operator_new__(uVar11);
                str_1 = pcVar15;
                std::vector<column_*,_std::allocator<column_*>_>::operator[]
                          (&this->table_cols,(long)str._4_4_);
                std::istream::read(local_290,(long)pcVar15);
                bVar1 = util::compareString(str_1,pcStack_2b0);
                if (bVar1) {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "Can\'t insert duplicate values to primary key column");
                  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                  if (str_1 != (char *)0x0) {
                    operator_delete(str_1);
                  }
                  this_local._7_1_ = false;
                  goto LAB_00138680;
                }
              }
            }
          }
        }
        else {
          ppEVar14 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                               (stmt->values,(long)str._4_4_);
          std::__cxx11::to_string(local_2f8,(*ppEVar14)->ival);
          pcVar15 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::string::~string((string *)local_2f8);
          local_2d8 = pcVar15;
          sVar13 = strlen(pcVar15);
          ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                               (&this->table_cols,(long)str._4_4_);
          if ((ulong)(long)(*ppcVar12)->element_truesize < sVar13) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Wrong Char size");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
            goto LAB_00138680;
          }
          if (pcStack_2a0 != (column *)0x0) {
            ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                 (&this->table_cols,(long)str._4_4_);
            bVar1 = util::compareString(&(*ppcVar12)->name,&pcStack_2a0->name);
            if (bVar1) {
              for (local_2fc = 0; iVar5 = local_2fc, iVar4 = getRowlength(this), iVar5 < iVar4;
                  local_2fc = local_2fc + 1) {
                iVar5 = local_2fc * this->rowSize;
                ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                     (&this->table_cols,(long)str._4_4_);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)&bytes_1,(long)(iVar5 + (*ppcVar12)->col_offset));
                std::istream::seekg(local_290,bytes_1,local_308);
                ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                     (&this->table_cols,(long)str._4_4_);
                uVar11 = (ulong)(*ppcVar12)->element_truesize;
                if ((long)uVar11 < 0) {
                  uVar11 = 0xffffffffffffffff;
                }
                pcVar15 = (char *)operator_new__(uVar11);
                pcStack_318 = pcVar15;
                std::vector<column_*,_std::allocator<column_*>_>::operator[]
                          (&this->table_cols,(long)str._4_4_);
                std::istream::read(local_290,(long)pcVar15);
                bVar1 = util::compareString(pcStack_318,local_2d8);
                if (bVar1) {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "Can\'t insert duplicate values to primary key column");
                  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                  if (pcStack_318 != (char *)0x0) {
                    operator_delete(pcStack_318);
                  }
                  this_local._7_1_ = false;
                  goto LAB_00138680;
                }
              }
            }
          }
        }
      }
      else {
        ppEVar14 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                             (stmt->values,(long)str._4_4_);
        if ((*ppEVar14)->type == kExprLiteralString) {
          poVar8 = std::operator<<((ostream *)&std::cout,"need a int value instead of a string");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
          goto LAB_00138680;
        }
        if (pcStack_2a0 != (column *)0x0) {
          ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                               (&this->table_cols,(long)str._4_4_);
          bVar1 = util::compareString(&(*ppcVar12)->name,&pcStack_2a0->name);
          if (bVar1) {
            for (local_31c = 0; iVar5 = local_31c, iVar4 = getRowlength(this), iVar5 < iVar4;
                local_31c = local_31c + 1) {
              iVar5 = local_31c * this->rowSize;
              ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                   (&this->table_cols,(long)str._4_4_);
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)&bytes_2,(long)(iVar5 + (*ppcVar12)->col_offset));
              std::istream::seekg(local_290,bytes_2,local_328);
              ppcVar12 = std::vector<column_*,_std::allocator<column_*>_>::operator[]
                                   (&this->table_cols,(long)str._4_4_);
              uVar11 = (ulong)(*ppcVar12)->element_truesize;
              if ((long)uVar11 < 0) {
                uVar11 = 0xffffffffffffffff;
              }
              pcVar15 = (char *)operator_new__(uVar11);
              std::vector<column_*,_std::allocator<column_*>_>::operator[]
                        (&this->table_cols,(long)str._4_4_);
              std::istream::read(local_290,(long)pcVar15);
              ppEVar14 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                                   (stmt->values,(long)str._4_4_);
              bVar1 = util::compareString(pcVar15,(char *)&(*ppEVar14)->ival);
              if (bVar1) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "Can\'t insert duplicate values to primary key column");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                if (pcVar15 != (char *)0x0) {
                  operator_delete(pcVar15);
                }
                this_local._7_1_ = false;
                goto LAB_00138680;
              }
            }
          }
        }
      }
    }
    std::fstream::close();
    this_local._7_1_ = true;
  }
LAB_00138680:
  primary._4_4_ = 1;
  std::fstream::~fstream(local_290);
  return this_local._7_1_;
}

Assistant:

bool table::insertcheck(hsql::InsertStatement *stmt) {

    if(stmt->columns != NULL && stmt->columns->size() != stmt->values->size()){
        cout <<"Column count doesn't match value count"<<endl;
        return false;
    }
    if(stmt->columns == NULL && table_cols.size() != stmt->values->size()){
        cout <<"INSERT has different number of columns than target columns"<<endl;
        return false;
    }
    if(stmt->columns != NULL){
        for(char* col_name : *stmt->columns){
            auto it = getColumn(col_name);
            if(it == NULL){
                cout <<"Unknown column "<<col_name<<" in table list'"<<endl;
                return false;
            }
        }
    }
    fstream os(filename, ios::in|ios::out|ios::binary|ios::app);
    if(!os.is_open()){
        cout << "cannot open table file" <<endl;
        return false;
    }

    //check insert type
    column* primary = getPrimaryKey();
    for(int i=0; i < table_cols.size(); i++){

        if(table_cols[i]->flag == "CHAR"){
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                const char* str = (*stmt->values)[i]->name ;
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary != nullptr && util::compareString(table_cols[i]->name, primary->name)){
                    cout << "check primary key values"<<endl;
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }

                    }
                }

            }
            else{
                const char* str = to_string( (*stmt->values)[i]->ival ).c_str();
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary!=nullptr&&util::compareString(table_cols[i]->name, primary->name)){
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }
                    }
                }
            }
        }
        else{
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                cout<<"need a int value instead of a string"<<endl;
                return false;
            }
            if(primary!= nullptr && util::compareString(table_cols[i]->name, primary->name)){
                for(int j=0 ; j < getRowlength(); j++){
                    os.seekg(j * rowSize + table_cols[i]->col_offset);
                    char *bytes = new char[table_cols[i]->element_truesize];
                    os.read(bytes, table_cols[i]->element_truesize);
                    //cout  << bytes <<endl;
                    if(util::compareString(bytes, (char*)&(*stmt->values)[i]->ival)){
                        cout<<"Can't insert duplicate values to primary key column"<<endl;
                        delete bytes;
                        return false;
                    }

                }
            }

        }
    }
    os.close();

    return true;
}